

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::backwardSimplify(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  undefined1 uVar2;
  Clause *in_RSI;
  long in_RDI;
  BwSimplificationRecord BVar3;
  Clause **unaff_retaddr;
  Clause *in_stack_00000008;
  SaturationAlgorithm *in_stack_00000010;
  Clause *replacement;
  Clause *redundant;
  BwSimplificationRecord srec;
  BwSimplificationRecordIterator simplifications;
  BackwardSimplificationEngine *bse;
  Iterator bsit;
  Clause *in_stack_ffffffffffffff78;
  Clause *in_stack_ffffffffffffff80;
  Clause *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  VirtualIterator<Inferences::BwSimplificationRecord> local_28;
  BackwardSimplificationEngine *local_20;
  undefined1 in_stack_ffffffffffffffef;
  Clause *this_00;
  
  Lib::List<Inferences::BackwardSimplificationEngine_*>::Iterator::Iterator
            ((Iterator *)&stack0xffffffffffffffe8,
             *(List<Inferences::BackwardSimplificationEngine_*> **)(in_RDI + 0xb0));
  BVar3.replacement = in_stack_ffffffffffffff80;
  BVar3.toRemove = in_stack_ffffffffffffff88;
  while( true ) {
    bVar1 = Lib::List<Inferences::BackwardSimplificationEngine_*>::Iterator::hasNext
                      ((Iterator *)0xad144c);
    if (!bVar1) break;
    local_20 = Lib::List<Inferences::BackwardSimplificationEngine_*>::Iterator::next
                         ((Iterator *)BVar3.replacement);
    Lib::VirtualIterator<Inferences::BwSimplificationRecord>::VirtualIterator(&local_28);
    (*(local_20->super_InferenceEngine)._vptr_InferenceEngine[5])(local_20,in_RSI,&local_28);
    while( true ) {
      uVar2 = Lib::VirtualIterator<Inferences::BwSimplificationRecord>::hasNext
                        ((VirtualIterator<Inferences::BwSimplificationRecord> *)0xad1499);
      if (!(bool)uVar2) break;
      BVar3 = Lib::VirtualIterator<Inferences::BwSimplificationRecord>::next
                        ((VirtualIterator<Inferences::BwSimplificationRecord> *)0xad14b6);
      this_00 = BVar3.toRemove;
      if ((SaturationAlgorithm *)BVar3.replacement != (SaturationAlgorithm *)0x0) {
        addNewClause((SaturationAlgorithm *)BVar3.replacement,in_stack_ffffffffffffff78);
      }
      onClauseReduction(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                        (uint)((ulong)in_RDI >> 0x20),in_RSI,(bool)in_stack_ffffffffffffffef);
      Kernel::Clause::incRefCnt(this_00);
      removeActiveOrPassiveClause
                ((SaturationAlgorithm *)CONCAT17(uVar2,in_stack_ffffffffffffff90),BVar3.toRemove);
      Kernel::Clause::decRefCnt((Clause *)0xad1569);
    }
    Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
              ((VirtualIterator<Inferences::BwSimplificationRecord> *)BVar3.replacement);
  }
  return;
}

Assistant:

void SaturationAlgorithm::backwardSimplify(Clause* cl)
{
  TIME_TRACE("backward simplification");

  BwSimplList::Iterator bsit(_bwSimplifiers);
  while (bsit.hasNext()) {
    BackwardSimplificationEngine *bse = bsit.next();

    BwSimplificationRecordIterator simplifications;
    bse->perform(cl, simplifications);
    while (simplifications.hasNext()) {
      BwSimplificationRecord srec = simplifications.next();
      Clause *redundant = srec.toRemove;
      ASS_NEQ(redundant, cl);

      Clause *replacement = srec.replacement;

      if (replacement) {
        addNewClause(replacement);
      }
      onClauseReduction(redundant, &replacement, 1, cl, false);

      // we must remove the redundant clause before adding its replacement,
      // as otherwise the redundant one might demodulate the replacement into
      // a tautology

      redundant->incRefCnt(); // we don't want the clause deleted before we record the simplification

      removeActiveOrPassiveClause(redundant);

      redundant->decRefCnt();
    }
  }
}